

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O0

MPP_RET h264d_flush(void *decoder)

{
  MPP_RET MVar1;
  H264_DecCtx_t *p_Dec;
  MPP_RET ret;
  void *decoder_local;
  
  if (decoder == (void *)0x0) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x1e0);
    }
  }
  else if (*(long *)((long)decoder + 0x38) == 0) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x1e1);
    }
  }
  else {
    if (*(long *)((long)decoder + 0x48) != 0) {
      MVar1 = output_dpb((H264_DecCtx_t *)decoder,
                         *(H264_DpbBuf_t **)(*(long *)((long)decoder + 0x48) + 0xa30));
      if (MVar1 < MPP_OK) {
        if ((h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_api","Function error(%d).\n",(char *)0x0,0x1e4);
        }
      }
      else {
        if (*(char *)((long)decoder + 0x60) == '\0') {
          return MPP_OK;
        }
        MVar1 = output_dpb((H264_DecCtx_t *)decoder,
                           *(H264_DpbBuf_t **)(*(long *)((long)decoder + 0x48) + 0xa38));
        if (MPP_NOK < MVar1) {
          return MPP_OK;
        }
        if ((h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_api","Function error(%d).\n",(char *)0x0,0x1e6);
        }
      }
      return MPP_NOK;
    }
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x1e2);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET  h264d_flush(void *decoder)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_DecCtx_t *p_Dec = (H264_DecCtx_t *)decoder;

    INP_CHECK(ret, !decoder);
    INP_CHECK(ret, !p_Dec->p_Inp);
    INP_CHECK(ret, !p_Dec->p_Vid);

    FUN_CHECK(ret = output_dpb(p_Dec, p_Dec->p_Vid->p_Dpb_layer[0]));
    if (p_Dec->mvc_valid) {
        FUN_CHECK(ret = output_dpb(p_Dec, p_Dec->p_Vid->p_Dpb_layer[1]));
    }

__RETURN:
    return ret = MPP_OK;
__FAILED:
    return ret = MPP_NOK;
}